

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_preallocated_clone(secp256k1_context *ctx,void *prealloc)

{
  secp256k1_context *ret;
  void *prealloc_local;
  secp256k1_context *ctx_local;
  
  if (prealloc == (void *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"prealloc != NULL");
    ctx_local = (secp256k1_context *)0x0;
  }
  else {
    memcpy(prealloc,ctx,0xd0);
    ctx_local = (secp256k1_context *)prealloc;
  }
  return ctx_local;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_clone(const secp256k1_context* ctx, void* prealloc) {
    secp256k1_context* ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(prealloc != NULL);

    ret = (secp256k1_context*)prealloc;
    *ret = *ctx;
    return ret;
}